

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int luaopen_string(lua_State *L)

{
  lua_State *L_local;
  
  lua_createtable(L,0,0xe);
  luaL_setfuncs(L,strlib,0);
  createmetatable(L);
  return 1;
}

Assistant:

LUAMOD_API int luaopen_string (lua_State *L) {
  luaL_newlib(L, strlib);
  createmetatable(L);
  return 1;
}